

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom3d.c
# Opt level: O0

matrix4 * v3rotationMat(vector3d *axis,double theta,matrix4 *m)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double z;
  double y;
  double x;
  double t;
  double s;
  double c;
  matrix4 *m_local;
  double theta_local;
  vector3d *axis_local;
  
  dVar1 = axis->x;
  dVar2 = axis->y;
  dVar3 = axis->z;
  dVar4 = cos(theta * 0.017453293);
  dVar5 = sin(theta * 0.017453293);
  dVar6 = 1.0 - dVar4;
  v3identityMat(m);
  m->element[0][0] = dVar6 * dVar1 * dVar1 + dVar4;
  m->element[0][1] = dVar6 * dVar1 * dVar2 + dVar3 * dVar5;
  m->element[0][2] = dVar6 * dVar1 * dVar3 + -(dVar2 * dVar5);
  m->element[1][0] = dVar6 * dVar2 * dVar1 + -(dVar3 * dVar5);
  m->element[1][1] = dVar6 * dVar2 * dVar2 + dVar4;
  m->element[1][2] = dVar6 * dVar2 * dVar3 + dVar1 * dVar5;
  m->element[2][0] = dVar6 * dVar3 * dVar1 + dVar2 * dVar5;
  m->element[2][1] = dVar6 * dVar3 * dVar2 + -(dVar1 * dVar5);
  m->element[2][2] = dVar6 * dVar3 * dVar3 + dVar4;
  return m;
}

Assistant:

matrix4*  v3rotationMat(vector3d* axis, double theta, matrix4* m) {
	double c, s, t, x, y, z;

	x = axis->x;
	y = axis->y;
	z = axis->z;

	c = cos(theta*DEG2RAD);
	s = sin(theta*DEG2RAD);
	t = 1.0 - c;

	v3identityMat(m);

	m->element[0][0] = t * x * x    +        c;
	m->element[0][1] = t * x * y    +    z * s;
	m->element[0][2] = t * x * z    -    y * s;

	m->element[1][0] = t * y * x    -    z * s;
	m->element[1][1] = t * y * y    +        c;
	m->element[1][2] = t * y * z    +    x * s;

	m->element[2][0] = t * z * x    +    y * s;
	m->element[2][1] = t * z * y    -    x * s;
	m->element[2][2] = t * z * z    +        c;

	return(m);
}